

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

void __thiscall AddrManImpl::MakeTried(AddrManImpl *this,AddrInfo *info,nid_type nId)

{
  int *piVar1;
  uint256 *nKey;
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  *this_00;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  mapped_type *pmVar7;
  const_iterator cVar8;
  mapped_type *this_01;
  Logger *this_02;
  ulong uVar9;
  uint bucket;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  int nUBucketPos;
  int nUBucket;
  nid_type nIdEvict;
  int nKBucketPos;
  int nKBucket;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nKey = &this->nKey;
  iVar4 = AddrInfo::GetNewBucket(info,nKey,&info->source,this->m_netgroupman);
  uVar6 = 0;
  do {
    bucket = iVar4 + uVar6 & 0x3ff;
    uVar5 = AddrInfo::GetBucketPosition(info,nKey,true,bucket);
    lVar2 = (ulong)(bucket << 9) + 0x20180;
    if (*(long *)((long)this->vvNew[0] + (ulong)uVar5 * 8 + lVar2 + -0x20180) == nId) {
      *(undefined8 *)((long)this->vvNew[0] + (ulong)uVar5 * 8 + lVar2 + -0x20180) =
           0xffffffffffffffff;
      piVar1 = &info->nRefCount;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
LAB_0084b4f8:
        this->nNew = this->nNew + -1;
        this_00 = &this->m_network_counts;
        local_58._M_dataplus._M_p._0_4_ = CNetAddr::GetNetwork((CNetAddr *)info);
        pmVar7 = std::__detail::
                 _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,(key_type *)&local_58);
        pmVar7->n_new = pmVar7->n_new - 1;
        if (info->nRefCount != 0) {
          __assert_fail("info.nRefCount == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                        ,0x1fd,"void AddrManImpl::MakeTried(AddrInfo &, nid_type)");
        }
        uVar5 = AddrInfo::GetTriedBucket(info,nKey,this->m_netgroupman);
        nKBucket = uVar5;
        uVar6 = AddrInfo::GetBucketPosition(info,nKey,false,uVar5);
        uVar9 = (ulong)uVar5;
        lVar2 = *(long *)((long)this->vvTried[0] + (ulong)uVar6 * 8 + (ulong)(uVar5 << 9));
        nKBucketPos = uVar6;
        if (lVar2 != -1) {
          nIdEvict = lVar2;
          cVar8 = std::
                  _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->mapInfo)._M_h,&nIdEvict);
          if (cVar8.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur ==
              (__node_type *)0x0) {
            __assert_fail("mapInfo.count(nIdEvict) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                          ,0x207,"void AddrManImpl::MakeTried(AddrInfo &, nid_type)");
          }
          this_01 = std::__detail::
                    _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->mapInfo,&nIdEvict);
          this_01->fInTried = false;
          *(undefined8 *)((long)this->vvTried[0] + (ulong)uVar6 * 8 + (ulong)(uVar5 << 9)) =
               0xffffffffffffffff;
          this->nTried = this->nTried + -1;
          local_58._M_dataplus._M_p._0_4_ = CNetAddr::GetNetwork((CNetAddr *)this_01);
          pmVar7 = std::__detail::
                   _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,(key_type *)&local_58);
          pmVar7->n_tried = pmVar7->n_tried - 1;
          iVar4 = AddrInfo::GetNewBucket(this_01,nKey,&this_01->source,this->m_netgroupman);
          nUBucket = iVar4;
          uVar5 = AddrInfo::GetBucketPosition(this_01,nKey,true,iVar4);
          nUBucketPos = uVar5;
          ClearNew(this,iVar4,uVar5);
          lVar2 = (ulong)(uint)(iVar4 << 9) + 0x20180;
          if (*(long *)((long)this->vvNew[0] + (ulong)uVar5 * 8 + lVar2 + -0x20180) != -1) {
            __assert_fail("vvNew[nUBucket][nUBucketPos] == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                          ,0x214,"void AddrManImpl::MakeTried(AddrInfo &, nid_type)");
          }
          this_01->nRefCount = 1;
          *(nid_type *)((long)this->vvNew[0] + (ulong)uVar5 * 8 + lVar2 + -0x20180) = nIdEvict;
          this->nNew = this->nNew + 1;
          local_58._M_dataplus._M_p._0_4_ = CNetAddr::GetNetwork((CNetAddr *)this_01);
          pmVar7 = std::__detail::
                   _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,(key_type *)&local_58);
          pmVar7->n_new = pmVar7->n_new + 1;
          this_02 = LogInstance();
          bVar3 = BCLog::Logger::WillLogCategoryLevel(this_02,ADDRMAN,Debug);
          if (bVar3) {
            CService::ToStringAddrPort_abi_cxx11_(&local_58,(CService *)this_01);
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
            ;
            source_file._M_len = 0x5b;
            logging_function._M_str = "MakeTried";
            logging_function._M_len = 9;
            LogPrintFormatInternal<std::__cxx11::string,int,int,int,int>
                      (logging_function,source_file,0x21c,ADDRMAN,Debug,
                       (ConstevalFormatString<5U>)0xf6ce24,&local_58,&nKBucket,&nKBucketPos,
                       &nUBucket,&nUBucketPos);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_58._M_dataplus._M_p._4_4_,(Network)local_58._M_dataplus._M_p) !=
                &local_58.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                       (Network)local_58._M_dataplus._M_p),
                              local_58.field_2._M_allocated_capacity + 1);
            }
            uVar9 = (ulong)nKBucket;
            uVar6 = nKBucketPos;
          }
        }
        if (this->vvTried[uVar9][(int)uVar6] != -1) {
          __assert_fail("vvTried[nKBucket][nKBucketPos] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                        ,0x21e,"void AddrManImpl::MakeTried(AddrInfo &, nid_type)");
        }
        this->vvTried[uVar9][(int)uVar6] = nId;
        this->nTried = this->nTried + 1;
        info->fInTried = true;
        local_58._M_dataplus._M_p._0_4_ = CNetAddr::GetNetwork((CNetAddr *)info);
        pmVar7 = std::__detail::
                 _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,(key_type *)&local_58);
        pmVar7->n_tried = pmVar7->n_tried + 1;
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return;
      }
    }
    if (0x3fe < uVar6) goto LAB_0084b4f8;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void AddrManImpl::MakeTried(AddrInfo& info, nid_type nId)
{
    AssertLockHeld(cs);

    // remove the entry from all new buckets
    const int start_bucket{info.GetNewBucket(nKey, m_netgroupman)};
    for (int n = 0; n < ADDRMAN_NEW_BUCKET_COUNT; ++n) {
        const int bucket{(start_bucket + n) % ADDRMAN_NEW_BUCKET_COUNT};
        const int pos{info.GetBucketPosition(nKey, true, bucket)};
        if (vvNew[bucket][pos] == nId) {
            vvNew[bucket][pos] = -1;
            info.nRefCount--;
            if (info.nRefCount == 0) break;
        }
    }
    nNew--;
    m_network_counts[info.GetNetwork()].n_new--;

    assert(info.nRefCount == 0);

    // which tried bucket to move the entry to
    int nKBucket = info.GetTriedBucket(nKey, m_netgroupman);
    int nKBucketPos = info.GetBucketPosition(nKey, false, nKBucket);

    // first make space to add it (the existing tried entry there is moved to new, deleting whatever is there).
    if (vvTried[nKBucket][nKBucketPos] != -1) {
        // find an item to evict
        nid_type nIdEvict = vvTried[nKBucket][nKBucketPos];
        assert(mapInfo.count(nIdEvict) == 1);
        AddrInfo& infoOld = mapInfo[nIdEvict];

        // Remove the to-be-evicted item from the tried set.
        infoOld.fInTried = false;
        vvTried[nKBucket][nKBucketPos] = -1;
        nTried--;
        m_network_counts[infoOld.GetNetwork()].n_tried--;

        // find which new bucket it belongs to
        int nUBucket = infoOld.GetNewBucket(nKey, m_netgroupman);
        int nUBucketPos = infoOld.GetBucketPosition(nKey, true, nUBucket);
        ClearNew(nUBucket, nUBucketPos);
        assert(vvNew[nUBucket][nUBucketPos] == -1);

        // Enter it into the new set again.
        infoOld.nRefCount = 1;
        vvNew[nUBucket][nUBucketPos] = nIdEvict;
        nNew++;
        m_network_counts[infoOld.GetNetwork()].n_new++;
        LogDebug(BCLog::ADDRMAN, "Moved %s from tried[%i][%i] to new[%i][%i] to make space\n",
                 infoOld.ToStringAddrPort(), nKBucket, nKBucketPos, nUBucket, nUBucketPos);
    }
    assert(vvTried[nKBucket][nKBucketPos] == -1);

    vvTried[nKBucket][nKBucketPos] = nId;
    nTried++;
    info.fInTried = true;
    m_network_counts[info.GetNetwork()].n_tried++;
}